

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O2

int __thiscall Pyraminx::get_heuristic(Pyraminx *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar1 = count_correct_interior(this);
  uVar2 = count_correct_corner(this);
  iVar3 = count_correct_edge(this);
  return (0x18 - iVar1) / 9 + (0xc - iVar3) / 6 + (uint)(uVar2 < 2);
}

Assistant:

int Pyraminx::get_heuristic(){
    int num_interior = 24;
    int num_corner = 4;
    int num_edge = 12;
    int interior_correct = count_correct_interior();
    int corner_correct = count_correct_corner();
    int edge_correct = count_correct_edge();

    int h = ((num_corner - corner_correct)/3) + 
        ((num_edge - edge_correct)/6) + 
        ((num_interior - interior_correct)/9);
    return h;
}